

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::save_load_online_state<dense_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               dense_parameters *weights)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  size_t sVar7;
  weight *pwVar8;
  float *pfVar9;
  char *pcVar10;
  byte in_DL;
  int __c;
  dense_iterator<float> *rhs;
  long in_RDI;
  long in_R8;
  long in_R9;
  dense_parameters *in_stack_00000008;
  iterator v_1;
  size_t i_1;
  weight *v;
  uint32_t stride;
  weight buff [4];
  stringstream __msg;
  size_t brw;
  uint32_t old_i;
  uint64_t i;
  uint64_t length;
  size_t in_stack_fffffffffffffd28;
  dense_parameters *in_stack_fffffffffffffd30;
  dense_parameters *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  int plineNumber;
  char *in_stack_fffffffffffffd58;
  vw_exception *in_stack_fffffffffffffd60;
  dense_iterator<float> local_260;
  dense_iterator<float> local_248;
  ulong local_230;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  size_t in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  stringstream local_1d0 [16];
  stringstream local_1c0 [192];
  char *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  io_buf *in_stack_ffffffffffffff18;
  size_t local_48;
  
  uVar1 = *(undefined4 *)(in_RDI + 0x50);
  if ((in_DL & 1) == 0) {
    dense_parameters::begin(in_stack_fffffffffffffd40);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffd40);
      rhs = &local_260;
      bVar2 = dense_iterator<float>::operator!=(&local_248,rhs);
      if (!bVar2) break;
      pfVar9 = dense_iterator<float>::operator*(&local_248);
      if ((*pfVar9 != 0.0) || (NAN(*pfVar9))) {
        pcVar10 = dense_iterator<float>::index(&local_248,(char *)rhs,__c);
        uVar3 = dense_parameters::stride_shift(in_stack_00000008);
        std::ostream::operator<<((void *)(in_R9 + 0x10),(ulong)pcVar10 >> ((byte)uVar3 & 0x3f));
        bVar2 = SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0);
        if (*(uint *)(in_RDI + 0x50) < 0x1f) {
          bin_text_write_fixed
                    ((io_buf *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (stringstream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     bVar2);
        }
        else {
          bin_text_write_fixed
                    ((io_buf *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (stringstream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     bVar2);
        }
        if ((in_R8 == 0) ||
           (((*(byte *)(in_R8 + 0x59) & 1) == 0 && ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          poVar5 = std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar9);
          std::operator<<(poVar5,"\n");
          dense_iterator<float>::operator*(&local_248);
          bin_text_write_fixed
                    ((io_buf *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (stringstream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        }
        else if ((((*(byte *)(in_R8 + 0x59) & 1) == 0) || ((*(byte *)(in_R8 + 0x58) & 1) != 0)) &&
                (((*(byte *)(in_R8 + 0x59) & 1) != 0 || ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          poVar5 = std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar9);
          poVar5 = std::operator<<(poVar5," ");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar9[1]);
          in_stack_fffffffffffffd40 = (dense_parameters *)std::operator<<(poVar5," ");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd40,pfVar9[2]);
          std::operator<<(poVar5,"\n");
          dense_iterator<float>::operator*(&local_248);
          bin_text_write_fixed
                    ((io_buf *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (stringstream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        }
        else {
          poVar5 = std::operator<<((ostream *)(in_R9 + 0x10),":");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar9);
          poVar5 = std::operator<<(poVar5," ");
          pfVar9 = dense_iterator<float>::operator*(&local_248);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar9[1]);
          std::operator<<(poVar5,"\n");
          dense_iterator<float>::operator*(&local_248);
          bin_text_write_fixed
                    ((io_buf *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     (stringstream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        }
      }
      dense_iterator<float>::operator++(&local_248);
    }
  }
  else {
    do {
      if (*(uint *)(in_RDI + 0x50) < 0x1f) {
        local_48 = io_buf::bin_read_fixed
                             (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      }
      else {
        local_48 = io_buf::bin_read_fixed
                             (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      }
      plineNumber = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
      if (local_48 != 0) {
        if (1L << ((byte)uVar1 & 0x3f) == 0) {
          std::__cxx11::stringstream::stringstream(local_1d0);
          poVar5 = std::operator<<((ostream *)(local_1d0 + 0x10),
                                   "Model content is corrupted, weight vector index ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
          poVar5 = std::operator<<(poVar5," must be less than total vector length ");
          std::ostream::operator<<(poVar5,0);
          uVar6 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,plineNumber,
                     in_stack_fffffffffffffd48);
          __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        memset(&stack0xfffffffffffffde8,0,0x10);
        if ((in_R8 == 0) ||
           (((*(byte *)(in_R8 + 0x59) & 1) == 0 && ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        }
        else if ((((*(byte *)(in_R8 + 0x59) & 1) == 0) || ((*(byte *)(in_R8 + 0x58) & 1) != 0)) &&
                (((*(byte *)(in_R8 + 0x59) & 1) != 0 || ((*(byte *)(in_R8 + 0x58) & 1) == 0)))) {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        }
        else {
          sVar7 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        }
        local_48 = sVar7 + local_48;
        uVar3 = dense_parameters::stride_shift(in_stack_00000008);
        uVar4 = 1 << ((byte)uVar3 & 0x1f);
        pwVar8 = dense_parameters::strided_index
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        for (local_230 = 0; local_230 < uVar4; local_230 = local_230 + 1) {
          pwVar8[local_230] = *(weight *)(&stack0xfffffffffffffde8 + local_230 * 4);
        }
      }
    } while (local_48 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}